

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_gga_inc.c
# Opt level: O2

void work_gga_vxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,xc_gga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double __x;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double __x_00;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double __x_01;
  double dVar99;
  double dVar100;
  double dVar101;
  double __x_02;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double __x_03;
  double dVar117;
  double dVar118;
  double __x_04;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double __x_05;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar142;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  undefined1 auVar181 [16];
  double __x_06;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double local_f38;
  double local_ef8;
  double local_e90;
  double local_e70;
  double local_e28;
  double local_d50;
  double local_c68;
  uint local_aa8;
  uint uStack_aa4;
  undefined8 local_a98;
  double local_898;
  double local_6a8;
  double local_4e0;
  double local_4d0;
  double local_108;
  
  local_e70 = 0.0;
  local_4e0 = 0.0;
  for (sVar9 = 0; np != sVar9; sVar9 = sVar9 + 1) {
    lVar7 = (long)(p->dim).rho * sVar9;
    dVar19 = rho[lVar7];
    if (p->nspin == 2) {
      dVar19 = dVar19 + rho[lVar7 + 1];
    }
    dVar236 = p->dens_threshold;
    if (dVar236 <= dVar19) {
      lVar8 = (long)(p->dim).sigma * sVar9;
      dVar19 = rho[lVar7];
      if (rho[lVar7] <= dVar236) {
        dVar19 = dVar236;
      }
      dVar20 = p->sigma_threshold * p->sigma_threshold;
      dVar29 = sigma[lVar8];
      if (sigma[lVar8] <= dVar20) {
        dVar29 = dVar20;
      }
      if (p->nspin == 2) {
        local_e70 = rho[lVar7 + 1];
        if (rho[lVar7 + 1] <= dVar236) {
          local_e70 = dVar236;
        }
        local_4e0 = sigma[lVar8 + 2];
        if (sigma[lVar8 + 2] <= dVar20) {
          local_4e0 = dVar20;
        }
      }
      __x_06 = dVar19 + local_e70;
      dVar143 = 1.0 / __x_06;
      dVar223 = (dVar19 + dVar19) * dVar143;
      dVar20 = p->zeta_threshold;
      dVar237 = dVar20 + -1.0;
      dVar182 = (local_e70 + local_e70) * dVar143;
      dVar261 = -dVar237;
      dVar94 = dVar19 - local_e70;
      dVar271 = dVar94 * dVar143;
      uVar10 = -(ulong)(dVar182 <= dVar20);
      uVar11 = -(ulong)(dVar223 <= dVar20);
      dVar144 = (double)(uVar11 & (ulong)dVar237 |
                        ~uVar11 & (uVar10 & (ulong)dVar261 | ~uVar10 & (ulong)dVar271)) + 1.0;
      dVar21 = cbrt(dVar20);
      dVar22 = cbrt(dVar144);
      dVar23 = cbrt(__x_06);
      dVar24 = p->cam_omega * 2.080083823051904;
      auVar140._0_8_ = cbrt(9.869604401089358);
      uVar12 = -(ulong)(1.0 - dVar271 <= dVar20);
      uVar13 = -(ulong)(dVar271 + 1.0 <= dVar20);
      dVar25 = (double)(~uVar13 & (uVar12 & (ulong)dVar261 | ~uVar12 & (ulong)dVar271) |
                       uVar13 & (ulong)dVar237) + 1.0;
      dVar26 = cbrt(dVar25);
      uVar14 = -(ulong)(dVar25 <= dVar20);
      dVar91 = (double)(uVar14 & (ulong)dVar21 | ~uVar14 & (ulong)dVar26);
      auVar140._8_8_ = dVar91;
      auVar181 = divpd(_DAT_00f4add0,auVar140);
      dVar205 = auVar181._0_8_;
      dVar25 = 1.0 / dVar23;
      dVar95 = auVar181._8_8_ * dVar205 * dVar24;
      dVar27 = (dVar25 * dVar95) / 3.0;
      dVar28 = dVar205 * 3.3019272488946267;
      if (dVar29 < 0.0) {
        dVar29 = sqrt(dVar29);
      }
      else {
        dVar29 = SQRT(dVar29);
      }
      dVar30 = cbrt(dVar19);
      dVar31 = (1.0 / dVar30) / dVar19;
      dVar96 = (dVar28 * dVar29 * dVar31) / 12.0;
      dVar322 = 15.0;
      if (dVar96 <= 15.0) {
        dVar322 = dVar96;
      }
      dVar32 = dVar322;
      if (dVar322 <= 1.0) {
        dVar32 = 1.0;
      }
      dVar33 = exp(dVar32 + -8.572844);
      dVar34 = log(dVar33 + 1.0);
      uVar15 = -(ulong)(15.0 < dVar96);
      uVar16 = -(ulong)(dVar96 < 1.0);
      dVar34 = (double)(~uVar16 & (uVar15 & 0x4021254bcf0b6b6e | ~uVar15 & (ulong)(dVar32 - dVar34))
                       | uVar16 & (ulong)dVar96);
      dVar32 = 1e-15;
      if (1e-15 <= dVar34) {
        dVar32 = dVar34;
      }
      dVar97 = dVar32 * dVar32;
      dVar224 = dVar97 * dVar97;
      dVar183 = dVar97 * 0.00979681 + dVar224 * 0.0410834;
      dVar145 = dVar97 * dVar183;
      dVar184 = dVar97 * dVar224 * 0.0347188 +
                dVar32 * dVar224 * 0.00120824 + dVar224 * 0.18744 + 1.0;
      dVar35 = 1.0 / dVar184;
      dVar146 = dVar145 * dVar35;
      dVar98 = 1.0 / (auVar140._0_8_ * auVar140._0_8_);
      dVar147 = 1.0 / (dVar23 * dVar23);
      dVar206 = dVar146 * 2.214317600459161;
      dVar36 = p->cam_omega * p->cam_omega;
      dVar185 = (double)(~-(ulong)(dVar27 < 14.0) & 0x4000000000000000 |
                        -(ulong)(dVar27 < 14.0) & 0x3ff74b6dffbb791d) * dVar36 * 1.4422495703074083;
      dVar207 = dVar91 * dVar91;
      dVar37 = 1.0 / dVar207;
      dVar148 = dVar147 * dVar98 * dVar37;
      dVar38 = dVar148 * dVar185 * 0.7381058668197203 + dVar206;
      dVar39 = xc_expint_e1_impl(dVar38,1);
      dVar40 = (dVar148 * dVar185) / 3.0;
      __x_01 = dVar146 + 0.57786348;
      dVar41 = dVar40 + __x_01;
      dVar42 = log(dVar41);
      dVar40 = dVar40 + dVar146;
      dVar43 = log(dVar40);
      dVar321 = 14.0;
      if (dVar27 <= 14.0) {
        dVar321 = dVar27;
      }
      dVar149 = dVar321 * dVar321;
      dVar99 = dVar321 * dVar149;
      dVar44 = dVar149 * dVar149;
      dVar208 = dVar321 * dVar44;
      dVar225 = dVar44 * dVar99;
      dVar100 = (dVar225 * -1.0676080470633098 +
                dVar208 * 4.217437034869465 +
                dVar321 * 1.7059169152930056 + dVar99 * -4.162270540644039) * 3.141592653589793;
      dVar293 = (double)(~-(ulong)(dVar321 < 14.0) & 0x4000000000000000 |
                        -(ulong)(dVar321 < 14.0) & 0x3ff74b6dffbb791d);
      dVar45 = dVar149 * dVar293;
      dVar46 = dVar45 * 2.214317600459161 + dVar206;
      if (dVar46 < 0.0) {
        dVar47 = sqrt(dVar46);
      }
      else {
        dVar47 = SQRT(dVar46);
      }
      dVar48 = xc_erfcx(dVar47);
      dVar150 = dVar149 * dVar44;
      dVar101 = dVar44 * dVar44;
      dVar49 = xc_expint_e1_impl(dVar46,1);
      __x_02 = dVar45 + __x_01;
      if (__x_02 < 0.0) {
        dVar209 = sqrt(__x_02);
      }
      else {
        dVar209 = SQRT(__x_02);
      }
      dVar151 = 1.0 / __x_02;
      dVar186 = dVar45 + dVar146;
      if (dVar186 < 0.0) {
        dVar50 = sqrt(dVar186);
      }
      else {
        dVar50 = SQRT(dVar186);
      }
      dVar51 = dVar101 * -0.20524577845574896 +
               dVar150 * 2.723636568586566 +
               dVar44 * -4.841839888141759 + dVar149 * 3.2686565979666846 + -1.0161144;
      dVar52 = log(dVar186 * dVar151);
      dVar102 = 1.0 / (dVar209 * __x_02);
      dVar152 = (1.0 / dVar50) * 2.478878780461809 + dVar102 * -0.5597387610403739;
      dVar153 = 1.0 / dVar186;
      dVar53 = __x_02 * __x_02;
      dVar103 = 1.0 / dVar53;
      dVar154 = dVar153 * -1.0933029406300512 + dVar103 * 0.49374260512735113;
      dVar104 = dVar209 * dVar53;
      dVar155 = dVar146 * 9.0 + dVar45 * 9.0 + -2.0322288;
      dVar307 = dVar50 * dVar186;
      dVar253 = dVar104 * 3.0;
      dVar254 = dVar253 * dVar155 + dVar307 * 4.12995389554944;
      dVar313 = __x_02 * dVar53;
      dVar226 = 1.0 / dVar313;
      dVar105 = dVar146 * 79.7154336165298 + -36.0;
      dVar299 = dVar186 * dVar186;
      dVar238 = 1.0 / dVar299;
      dVar227 = dVar226 * 0.2508588461882105 + dVar105 * 0.007715016088131 * dVar238;
      dVar106 = dVar45 * -6.0966864 + dVar299 * 27.0 + dVar146 * -6.0966864 + 4.12995389554944;
      dVar286 = 1.0 / (dVar209 * dVar313);
      dVar278 = dVar209 * dVar313 * 9.0;
      dVar187 = 1.0 / (dVar50 * dVar299);
      dVar239 = dVar50 * dVar299 * -41.96505624603882 + dVar106 * dVar278;
      dVar53 = dVar53 * dVar53;
      dVar314 = dVar186 * dVar299;
      dVar156 = dVar293 * dVar53 * 81.27826616498021;
      dVar272 = dVar45 * 329.2210656 + dVar299 * -729.0 + dVar146 * 329.2210656 +
                -297.35668047955966;
      dVar279 = dVar53 * 0.008401793031216;
      dVar280 = dVar279 * dVar272 + dVar156 * dVar186 + dVar314 * 3.384784484376542;
      dVar300 = 1.0 / dVar104;
      dVar301 = dVar300 * dVar254;
      dVar107 = 1.0 / dVar307;
      dVar262 = dVar208 * dVar107;
      local_e90 = dVar286 * dVar239;
      dVar308 = dVar225 * dVar187;
      dVar108 = 1.0 / dVar53;
      dVar45 = dVar108 * dVar280;
      dVar109 = 1.0 / dVar314;
      dVar188 = dVar101 * dVar109;
      dVar240 = (1.0 / dVar209) * -1.0159746228068032;
      if (dVar27 <= 14.0) {
        local_f38 = dVar52 * 0.5080572 +
                    dVar45 * 0.007566670425467926 * dVar188 +
                    local_e90 * 0.0026165591067112575 * dVar308 +
                    dVar227 * dVar150 +
                    dVar301 * -0.09302717396924197 * dVar262 +
                    dVar154 * dVar44 +
                    dVar152 * dVar99 +
                    dVar151 * 0.738073119521991 * dVar149 +
                    dVar240 * dVar27 + (dVar100 * dVar48 * 0.5 - dVar51 * dVar49 * 0.5);
      }
      else {
        local_f38 = dVar43 * 0.5080572 + dVar39 * 0.5080572 + dVar42 * -0.5080572;
      }
      dVar241 = __x_01 * __x_01;
      dVar43 = dVar183 * 6.4753871 * dVar35 + 0.4796583;
      dVar42 = __x_01 * dVar241;
      dVar52 = (dVar43 * dVar97 + 1.0) * -0.463292766;
      dVar157 = (dVar42 * 8.1289152 + dVar241 * -1.48683344 + dVar52 * __x_01 + -0.779335965) *
                1.7724538509055159;
      if (__x_01 < 0.0) {
        dVar54 = sqrt(__x_01);
      }
      else {
        dVar54 = SQRT(__x_01);
      }
      uVar17 = -(ulong)(dVar144 <= dVar20);
      dVar110 = dVar42 * dVar54;
      dVar294 = 1.0 / dVar110;
      dVar55 = exp(dVar206);
      if (dVar146 < 0.0) {
        dVar189 = sqrt(dVar146);
      }
      else {
        dVar189 = SQRT(dVar146);
      }
      dVar316 = (double)(~uVar17 & (ulong)(dVar22 * dVar144) | uVar17 & (ulong)(dVar20 * dVar21));
      dVar144 = erf(dVar189 * 1.4880583323442536);
      dVar144 = 1.0 - dVar144;
      dVar242 = (dVar55 * dVar144 * -2.3751029502456897 +
                dVar157 * dVar294 * 0.0625 + 2.356194490192345) * 0.5641895835477563;
      dVar56 = (1.0 / dVar97) * dVar110;
      if (dVar32 <= 0.08) {
        dVar255 = dVar224 * 0.08534541323 + dVar97 * -0.07117647788 + -0.0262841788;
      }
      else {
        dVar255 = dVar242 * -1.0666666666666667 * dVar56;
      }
      dVar281 = dVar97 * dVar255;
      dVar111 = dVar97 * __x_01 * -0.077215461;
      dVar57 = dVar281 + dVar281 +
               dVar111 * dVar43 +
               ((dVar241 * -0.37170836 + -0.14853145700326428) - dVar146 * 0.077215461);
      dVar58 = dVar36 * 1.4422495703074083;
      dVar295 = dVar148 * dVar58;
      __x = dVar295 / 3.0 + __x_01;
      dVar190 = dVar97 * __x;
      dVar191 = dVar281 * 15.0 +
                dVar43 * dVar190 * -0.463292766 +
                dVar295 * -0.154430922 +
                dVar146 * -0.463292766 + __x * __x * -1.48683344 + -1.0470559350195856;
      dVar112 = dVar25 * dVar191;
      if (__x < 0.0) {
        dVar59 = sqrt(__x);
      }
      else {
        dVar59 = SQRT(__x);
      }
      dVar228 = (1.0 / dVar59) / (__x * __x);
      dVar59 = p->dens_threshold;
      dVar256 = (dVar36 * p->cam_omega) / 9.869604401089358;
      dVar210 = 1.0 / (dVar91 * dVar207);
      dVar113 = dVar36 * dVar36 * p->cam_omega * 1.4422495703074083;
      dVar211 = dVar98 / 9.869604401089358;
      dVar192 = 1.0 / (dVar207 * dVar207);
      dVar193 = (dVar192 / dVar91) * dVar211 * dVar113;
      dVar212 = (1.0 / __x_01) * dVar228;
      dVar222 = dVar112 * dVar95;
      dVar243 = dVar210 * dVar256 * 0.14814814814814814;
      dVar194 = dVar193 * 0.09876543209876543;
      dVar60 = dVar23 * dVar316 * -0.36927938319101117;
      dVar114 = (double)(uVar10 & (ulong)dVar237 |
                        ~uVar10 & ((ulong)dVar261 & uVar11 | ~uVar11 & (ulong)(dVar143 * -dVar94)))
                + 1.0;
      dVar91 = p->zeta_threshold;
      dVar261 = cbrt(dVar114);
      dVar237 = (double)(uVar12 & (ulong)dVar237 |
                        ~uVar12 & ((~uVar13 & (ulong)dVar271 | uVar13 & (ulong)dVar237) ^
                                  0x8000000000000000)) + 1.0;
      dVar61 = cbrt(dVar237);
      uVar10 = -(ulong)(dVar237 <= dVar91);
      dVar237 = (double)((ulong)dVar21 & uVar10 | ~uVar10 & (ulong)dVar61);
      dVar158 = (1.0 / dVar237) * dVar205 * dVar24;
      dVar62 = (dVar25 * dVar158) / 3.0;
      if (local_4e0 < 0.0) {
        dVar63 = sqrt(local_4e0);
      }
      else {
        dVar63 = SQRT(local_4e0);
      }
      dVar42 = 1.0 / dVar42;
      dVar64 = cbrt(local_e70);
      dVar65 = (1.0 / dVar64) / local_e70;
      dVar115 = (dVar28 * dVar63 * dVar65) / 12.0;
      dVar66 = 15.0;
      if (dVar115 <= 15.0) {
        dVar66 = dVar115;
      }
      dVar67 = dVar66;
      if (dVar66 <= 1.0) {
        dVar67 = 1.0;
      }
      dVar68 = exp(dVar67 + -8.572844);
      dVar69 = log(dVar68 + 1.0);
      uVar12 = -(ulong)(15.0 < dVar115);
      uVar13 = -(ulong)(dVar115 < 1.0);
      dVar69 = (double)(~uVar13 & (uVar12 & 0x4021254bcf0b6b6e | ~uVar12 & (ulong)(dVar67 - dVar69))
                       | uVar13 & (ulong)dVar115);
      dVar67 = 1e-15;
      if (1e-15 <= dVar69) {
        dVar67 = dVar69;
      }
      dVar116 = dVar67 * dVar67;
      dVar229 = dVar116 * dVar116;
      dVar195 = dVar116 * 0.00979681 + dVar229 * 0.0410834;
      dVar159 = dVar116 * dVar195;
      dVar196 = dVar116 * dVar229 * 0.0347188 +
                dVar67 * dVar229 * 0.00120824 + dVar229 * 0.18744 + 1.0;
      dVar70 = 1.0 / dVar196;
      dVar160 = dVar159 * dVar70;
      __x_03 = dVar160 * 2.214317600459161;
      dVar161 = (double)(~-(ulong)(dVar62 < 14.0) & 0x4000000000000000 |
                        -(ulong)(dVar62 < 14.0) & 0x3ff74b6dffbb791d) * dVar36 * 1.4422495703074083;
      dVar71 = dVar237 * dVar237;
      dVar117 = 1.0 / dVar71;
      dVar118 = dVar147 * dVar98 * dVar117;
      dVar72 = dVar118 * dVar161 * 0.7381058668197203 + __x_03;
      dVar73 = xc_expint_e1_impl(dVar72,1);
      dVar74 = (dVar118 * dVar161) / 3.0;
      __x_04 = dVar160 + 0.57786348;
      dVar75 = dVar74 + __x_04;
      dVar76 = log(dVar75);
      dVar74 = dVar74 + dVar160;
      dVar77 = log(dVar74);
      dVar197 = 14.0;
      if (dVar62 <= 14.0) {
        dVar197 = dVar62;
      }
      dVar162 = dVar197 * dVar197;
      dVar119 = dVar197 * dVar162;
      dVar78 = dVar162 * dVar162;
      dVar230 = dVar197 * dVar78;
      dVar213 = dVar78 * dVar119;
      dVar120 = (dVar213 * -1.0676080470633098 +
                dVar230 * 4.217437034869465 +
                dVar197 * 1.7059169152930056 + dVar119 * -4.162270540644039) * 3.141592653589793;
      dVar6 = (double)(~-(ulong)(dVar197 < 14.0) & 0x4000000000000000 |
                      -(ulong)(dVar197 < 14.0) & 0x3ff74b6dffbb791d);
      dVar79 = dVar162 * dVar6;
      dVar80 = dVar79 * 2.214317600459161 + __x_03;
      if (dVar80 < 0.0) {
        dVar121 = sqrt(dVar80);
      }
      else {
        dVar121 = SQRT(dVar80);
      }
      dVar146 = dVar281 * 5.0 +
                dVar43 * dVar190 * -0.077215461 +
                dVar295 * -0.025738487 + (-0.30439865000326427 - dVar146 * 0.077215461);
      dVar295 = dVar147 / __x_06;
      dVar81 = dVar143 * dVar243;
      dVar82 = xc_erfcx(dVar121);
      dVar163 = dVar162 * dVar78;
      dVar122 = dVar78 * dVar78;
      dVar83 = xc_expint_e1_impl(dVar80,1);
      __x_05 = dVar79 + __x_04;
      if (__x_05 < 0.0) {
        dVar214 = sqrt(__x_05);
      }
      else {
        dVar214 = SQRT(__x_05);
      }
      dVar84 = (1.0 / dVar241) * dVar228;
      dVar85 = dVar295 * (dVar281 + -0.051955731);
      dVar164 = 1.0 / __x_05;
      dVar198 = dVar79 + dVar160;
      if (dVar198 < 0.0) {
        dVar86 = sqrt(dVar198);
      }
      else {
        dVar86 = SQRT(dVar198);
      }
      dVar123 = dVar42 * dVar228;
      dVar87 = dVar122 * -0.20524577845574896 +
               dVar163 * 2.723636568586566 +
               dVar78 * -4.841839888141759 + dVar162 * 3.2686565979666846 + -1.0161144;
      dVar88 = log(dVar198 * dVar164);
      dVar89 = 1.0 / (dVar214 * __x_05);
      dVar165 = (1.0 / dVar86) * 2.478878780461809 + dVar89 * -0.5597387610403739;
      dVar166 = 1.0 / dVar198;
      dVar315 = __x_05 * __x_05;
      dVar124 = 1.0 / dVar315;
      dVar167 = dVar166 * -1.0933029406300512 + dVar124 * 0.49374260512735113;
      dVar296 = dVar214 * dVar315;
      dVar168 = dVar160 * 9.0 + dVar79 * 9.0 + -2.0322288;
      dVar125 = dVar86 * dVar198;
      dVar297 = dVar296 * 3.0;
      dVar298 = dVar297 * dVar168 + dVar125 * 4.12995389554944;
      dVar263 = __x_05 * dVar315;
      dVar169 = 1.0 / dVar263;
      dVar126 = dVar160 * 79.7154336165298 + -36.0;
      dVar309 = dVar198 * dVar198;
      dVar244 = 1.0 / dVar309;
      dVar170 = dVar169 * 0.2508588461882105 + dVar126 * 0.007715016088131 * dVar244;
      dVar127 = dVar79 * -6.0966864 + dVar309 * 27.0 + dVar160 * -6.0966864 + 4.12995389554944;
      dVar199 = 1.0 / (dVar214 * dVar263);
      dVar287 = dVar214 * dVar263 * 9.0;
      dVar231 = 1.0 / (dVar86 * dVar309);
      dVar282 = dVar86 * dVar309 * -41.96505624603882 + dVar127 * dVar287;
      dVar315 = dVar315 * dVar315;
      dVar264 = dVar198 * dVar309;
      dVar171 = dVar6 * dVar315 * 81.27826616498021;
      dVar257 = dVar79 * 329.2210656 + dVar309 * -729.0 + dVar160 * 329.2210656 +
                -297.35668047955966;
      dVar128 = dVar315 * 0.008401793031216;
      dVar310 = dVar128 * dVar257 + dVar171 * dVar198 + dVar264 * 3.384784484376542;
      dVar245 = 1.0 / dVar296;
      dVar246 = dVar245 * dVar298;
      dVar129 = 1.0 / dVar125;
      dVar79 = dVar230 * dVar129;
      dVar200 = dVar199 * dVar282;
      dVar288 = dVar213 * dVar231;
      dVar130 = 1.0 / dVar315;
      dVar283 = dVar130 * dVar310;
      dVar131 = 1.0 / dVar264;
      dVar258 = dVar122 * dVar131;
      dVar311 = (1.0 / dVar214) * -1.0159746228068032;
      if (dVar62 <= 14.0) {
        local_ef8 = dVar88 * 0.5080572 +
                    dVar283 * 0.007566670425467926 * dVar258 +
                    dVar200 * 0.0026165591067112575 * dVar288 +
                    dVar170 * dVar163 +
                    dVar246 * -0.09302717396924197 * dVar79 +
                    dVar167 * dVar78 +
                    dVar165 * dVar119 +
                    dVar164 * 0.738073119521991 * dVar162 +
                    dVar311 * dVar62 + (dVar120 * dVar82 * 0.5 - dVar87 * dVar83 * 0.5);
      }
      else {
        local_ef8 = dVar77 * 0.5080572 + dVar73 * 0.5080572 + dVar76 * -0.5080572;
      }
      dVar215 = __x_04 * __x_04;
      dVar77 = dVar195 * 6.4753871 * dVar70 + 0.4796583;
      dVar76 = __x_04 * dVar215;
      dVar88 = (dVar77 * dVar116 + 1.0) * -0.463292766;
      dVar172 = (dVar76 * 8.1289152 + dVar215 * -1.48683344 + dVar88 * __x_04 + -0.779335965) *
                1.7724538509055159;
      if (__x_04 < 0.0) {
        dVar90 = sqrt(__x_04);
      }
      else {
        dVar90 = SQRT(__x_04);
      }
      dVar216 = dVar85 * dVar194 * dVar123 +
                dVar146 * dVar81 * dVar84 +
                local_f38 * -0.8888888888888888 + dVar57 * -0.4444444444444444 * dVar42 +
                (dVar222 * dVar212) / 27.0;
      uVar18 = -(ulong)(dVar114 <= dVar91);
      dVar132 = dVar76 * dVar90;
      dVar302 = 1.0 / dVar132;
      dVar91 = exp(__x_03);
      if (dVar160 < 0.0) {
        dVar201 = sqrt(dVar160);
      }
      else {
        dVar201 = SQRT(dVar160);
      }
      local_a98._0_4_ = (uint)-(ulong)(dVar19 <= dVar236);
      local_a98._4_4_ = (uint)(-(ulong)(dVar19 <= dVar236) >> 0x20);
      local_aa8 = SUB84(dVar60 * dVar216,0);
      uStack_aa4 = (uint)((ulong)(dVar60 * dVar216) >> 0x20);
      local_a98 = (double)CONCAT44(~local_a98._4_4_ & uStack_aa4,~(uint)local_a98 & local_aa8);
      dVar204 = (double)(~uVar18 & (ulong)(dVar114 * dVar261) | (ulong)(dVar20 * dVar21) & uVar18);
      dVar21 = erf(dVar201 * 1.4880583323442536);
      dVar21 = 1.0 - dVar21;
      dVar133 = (dVar91 * dVar21 * -2.3751029502456897 +
                dVar172 * dVar302 * 0.0625 + 2.356194490192345) * 0.5641895835477563;
      dVar114 = (1.0 / dVar116) * dVar132;
      if (dVar67 <= 0.08) {
        dVar134 = dVar229 * 0.08534541323 + dVar116 * -0.07117647788 + -0.0262841788;
      }
      else {
        dVar134 = dVar133 * -1.0666666666666667 * dVar114;
      }
      dVar247 = dVar116 * dVar134;
      dVar135 = dVar116 * __x_04 * -0.077215461;
      dVar92 = dVar247 + dVar247 +
               dVar135 * dVar77 +
               ((dVar215 * -0.37170836 + -0.14853145700326428) - dVar160 * 0.077215461);
      dVar76 = 1.0 / dVar76;
      dVar289 = dVar58 * dVar118;
      __x_00 = dVar289 / 3.0 + __x_04;
      dVar173 = dVar116 * __x_00;
      dVar174 = dVar247 * 15.0 +
                dVar77 * dVar173 * -0.463292766 +
                dVar289 * -0.154430922 +
                dVar160 * -0.463292766 + __x_00 * __x_00 * -1.48683344 + -1.0470559350195856;
      dVar136 = dVar25 * dVar174;
      if (__x_00 < 0.0) {
        dVar93 = sqrt(__x_00);
      }
      else {
        dVar93 = SQRT(__x_00);
      }
      dVar265 = (1.0 / dVar93) / (__x_00 * __x_00);
      dVar93 = 1.0 / (dVar237 * dVar71);
      dVar202 = dVar247 * 5.0 +
                dVar77 * dVar173 * -0.077215461 +
                dVar289 * -0.025738487 + (-0.30439865000326427 - dVar160 * 0.077215461);
      dVar217 = (1.0 / dVar215) * dVar265;
      dVar175 = 1.0 / (dVar71 * dVar71);
      dVar176 = (dVar175 / dVar237) * dVar211 * dVar113;
      dVar160 = dVar295 * (dVar247 + -0.051955731);
      dVar248 = dVar76 * dVar265;
      dVar289 = dVar265 * (1.0 / __x_04);
      dVar142 = dVar136 * dVar158;
      dVar284 = dVar256 * dVar93 * 0.14814814814814814;
      dVar137 = dVar143 * dVar284;
      dVar177 = dVar176 * 0.09876543209876543;
      dVar178 = dVar177 * dVar160 * dVar248 +
                dVar137 * dVar202 * dVar217 +
                (dVar142 * dVar289) / 27.0 +
                local_ef8 * -0.8888888888888888 + dVar92 * -0.4444444444444444 * dVar76;
      dVar237 = dVar23 * dVar204 * -0.36927938319101117;
      local_a98 = local_a98 + (double)(~-(ulong)(local_e70 <= dVar59) & (ulong)(dVar237 * dVar178));
      pdVar1 = out->zk;
      if ((pdVar1 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
        lVar7 = (long)(p->dim).zk * sVar9;
        pdVar1[lVar7] = pdVar1[lVar7] + local_a98;
      }
      dVar138 = 1.0 / (__x_06 * __x_06);
      dVar249 = dVar143 - dVar94 * dVar138;
      bVar2 = dVar20 < dVar182;
      bVar3 = dVar20 < dVar223;
      dVar223 = 0.0;
      if (bVar3 && bVar2) {
        dVar223 = dVar249;
      }
      dVar273 = (dVar28 * dVar29 * ((1.0 / dVar30) / (dVar19 * dVar19))) / -9.0;
      dVar218 = 1.0 / (dVar33 + 1.0);
      dVar30 = 0.0;
      if (dVar96 <= 15.0) {
        dVar30 = (double)(~uVar15 & (ulong)dVar273 & -(ulong)(1.0 < dVar322));
        dVar30 = dVar30 - dVar33 * dVar30 * dVar218;
      }
      bVar4 = dVar20 < 1.0 - dVar271;
      bVar5 = dVar20 < dVar271 + 1.0;
      dVar271 = 0.0;
      if (bVar5 && bVar4) {
        dVar271 = dVar249;
      }
      dVar179 = dVar316 * dVar147 * 0.9847450218426964 * dVar216 * 0.125;
      dVar266 = (double)(~-(ulong)(dVar34 < 1e-15) &
                        ((ulong)dVar273 & uVar16 | ~uVar16 & (ulong)dVar30));
      dVar290 = dVar266 * dVar35 * dVar32 * dVar183;
      dVar316 = dVar32 * dVar97;
      dVar30 = dVar266 * dVar316;
      dVar317 = dVar32 * dVar266 * 0.01959362 + dVar30 * 0.1643336;
      dVar259 = dVar97 * dVar317 * dVar35;
      dVar274 = 1.0 / (dVar184 * dVar184);
      dVar303 = dVar32 * dVar224 * 0.2083128;
      dVar184 = dVar303 * dVar266 + dVar30 * 0.74976 + dVar266 * dVar224 * 0.0060412;
      dVar267 = dVar184 * dVar274 * dVar145;
      dVar203 = 1.0 / (dVar26 * dVar26);
      dVar219 = (double)(~uVar14 & (ulong)((dVar271 * dVar203) / 3.0));
      dVar271 = dVar36 * 0.0 * 1.4422495703074083;
      dVar148 = dVar148 * dVar271;
      dVar36 = dVar148 * 0.7381058668197203;
      dVar285 = dVar147 * dVar98 * dVar210 * dVar219 * dVar185;
      dVar273 = dVar98 * dVar37 * dVar295;
      dVar250 = dVar273 * dVar185;
      dVar139 = dVar250 * 0.4920705778798135;
      dVar250 = dVar250 * 0.2222222222222222;
      local_d50 = 0.0;
      dVar318 = dVar149 * 0.0;
      dVar220 = dVar24 * dVar205;
      dVar221 = dVar25 / __x_06;
      dVar26 = (dVar221 * dVar95) / 9.0;
      if (dVar27 <= 14.0) {
        local_d50 = (dVar25 * dVar37 * dVar220 * dVar219) / -3.0 - dVar26;
      }
      dVar232 = (dVar259 * 2.214317600459161 + dVar290 * 4.428635200918322) -
                dVar267 * 2.214317600459161;
      dVar148 = dVar148 / 3.0;
      dVar291 = (dVar290 + dVar290 + dVar259) - dVar267;
      dVar39 = dVar39 - 1.0 / dVar38;
      dVar41 = 1.0 / dVar41;
      dVar40 = 1.0 / dVar40;
      dVar307 = dVar307 * -104.91264061509705;
      dVar38 = dVar104 * dVar106 * 31.5;
      dVar51 = dVar51 * (dVar49 - 1.0 / dVar46);
      dVar101 = dVar101 * (1.0 / (dVar299 * dVar299));
      dVar268 = dVar154 * dVar99 * 4.0;
      dVar312 = dVar149 * dVar103 * -0.738073119521991;
      dVar275 = dVar321 * dVar151 * 1.476146239043982;
      dVar304 = dVar152 * dVar149 * 3.0;
      dVar292 = dVar227 * dVar208 * 6.0;
      dVar319 = (1.0 / (__x_02 * dVar53)) * dVar280 * -0.030266681701871703;
      dVar46 = dVar102 * dVar321 * 0.5079873114034016;
      dVar102 = dVar45 * -0.022700011276403777;
      dVar104 = ((1.0 / dVar209) / dVar53) * dVar239 * -0.0091579568734894;
      dVar106 = ((1.0 / dVar50) / dVar314) * dVar225;
      dVar227 = dVar187 * dVar208;
      dVar103 = dVar103 * dVar186;
      dVar152 = dVar53 * 0.0 * 81.27826616498021 * dVar186;
      dVar53 = dVar293 * dVar313 * 325.11306465992084;
      dVar299 = dVar299 * 10.154353453129625;
      dVar154 = dVar272 * dVar313 * 0.033607172124864;
      dVar272 = dVar155 * dVar209 * __x_02 * 7.5;
      dVar155 = ((dVar47 + dVar47) * dVar48 + -1.1283791670955126) * (1.0 / dVar47);
      dVar280 = dVar300 * 0.8396081415605609;
      dVar239 = dVar238 * 1.0933029406300512;
      dVar105 = dVar105 * dVar109 * -0.015430032176262;
      dVar209 = dVar254 * dVar286 * 0.23256793492310493;
      dVar47 = dVar301 * 0.13954076095386297;
      if (dVar27 <= 14.0) {
        dVar313 = dVar321 * dVar293 * local_d50;
        dVar254 = dVar313 + dVar313 + dVar318 + dVar291;
        dVar314 = dVar186 * dVar254;
        dVar285 = dVar313 * 4.428635200918322 + dVar318 * 2.214317600459161 + dVar232;
        local_c68 = dVar308 * dVar254 * dVar104 +
                    dVar225 * dVar109 * local_d50 * dVar45 * 0.060533363403743407 +
                    dVar101 * dVar254 * dVar102 +
                    dVar188 * dVar254 * dVar319 +
                    dVar48 * (dVar150 * local_d50 * -7.473256329443169 +
                             dVar44 * local_d50 * 21.087185174347326 +
                             local_d50 * 1.7059169152930056 +
                             dVar149 * local_d50 * -12.48681162193212) * 3.141592653589793 * 0.5 +
                    dVar304 * local_d50 +
                    dVar275 * local_d50 +
                    dVar254 * dVar312 +
                    dVar46 * dVar254 +
                    ((((dVar313 * -12.1933728 +
                       ((dVar267 * 6.0966864 +
                        dVar259 * -6.0966864 + dVar314 * 54.0 + dVar290 * -12.1933728) -
                       dVar318 * 6.0966864)) * dVar278 + dVar307 * dVar254 + dVar38 * dVar254) *
                      dVar286 * 0.0026165591067112575 * dVar308 + dVar268 * local_d50) -
                    dVar285 * dVar51 * 0.5) + dVar292 * local_d50 +
                    dVar150 * (dVar105 * dVar254 +
                              dVar108 * dVar254 * -0.7525765385646315 +
                              (dVar267 * -79.7154336165298 +
                              dVar290 * 159.4308672330596 + dVar259 * 79.7154336165298) *
                              0.007715016088131 * dVar238) +
                    dVar44 * (dVar239 * dVar254 + dVar226 * -0.9874852102547023 * dVar254) +
                    ((dVar240 * local_d50 +
                     (dVar107 * -1.2394393902309044 * dVar254 + dVar280 * dVar254) * dVar99 +
                     dVar155 * dVar285 * dVar100 * 0.25 +
                     (dVar50 * dVar254 * 6.19493084332416 +
                     dVar272 * dVar254 +
                     (dVar313 * 18.0 +
                     dVar267 * -9.0 + dVar290 * 18.0 + dVar259 * 9.0 + dVar318 * 9.0) * dVar253) *
                     dVar300 * -0.09302717396924197 * dVar262 +
                     ((dVar313 * 658.4421312 +
                      dVar267 * -329.2210656 +
                      dVar259 * 329.2210656 + dVar314 * -1458.0 + dVar290 * 658.4421312 +
                      dVar318 * 329.2210656) * dVar279 +
                     dVar154 * dVar254 +
                     dVar299 * dVar254 + dVar156 * dVar254 + dVar53 * dVar314 + dVar152) * dVar108 *
                     0.007566670425467926 * dVar188 +
                     (dVar254 * dVar151 - dVar254 * dVar103) * dVar153 * 0.5080572 * __x_02 +
                     dVar227 * dVar254 * dVar47 +
                     dVar262 * dVar254 * dVar209 +
                     dVar44 * dVar107 * local_d50 * dVar301 * -0.46513586984620986 +
                     dVar150 * dVar187 * local_d50 * local_e90 * 0.0183159137469788 +
                     dVar106 * dVar254 * local_e90 * -0.006541397766778144) -
                    (dVar225 * -1.6419662276459916 * local_d50 +
                    dVar208 * local_d50 * 16.341819411519396 +
                    dVar27 * local_d50 * 6.537313195933369 +
                    dVar99 * local_d50 * -19.367359552567034) * dVar49 * 0.5);
      }
      else {
        dVar254 = ((dVar285 * -0.6666666666666666 + dVar148 + dVar291) - dVar250) * 0.5080572;
        local_c68 = dVar254 * dVar40 +
                    (((dVar285 * -1.4762117336394407 + dVar36 + dVar232) - dVar139) * dVar39 *
                     0.5080572 - dVar41 * dVar254);
      }
      dVar206 = exp(-dVar206);
      dVar254 = dVar183 * dVar274 * -6.4753871;
      dVar285 = dVar317 * 6.4753871 * dVar35 + dVar184 * dVar254;
      dVar110 = (1.0 / dVar316) * dVar110;
      dVar314 = (1.0 / dVar97) * dVar241 * dVar54;
      dVar313 = dVar32 * dVar43 + dVar32 * dVar43;
      dVar54 = (1.0 / dVar54) / (dVar241 * dVar241);
      dVar157 = dVar157 * -0.21875;
      dVar184 = dVar206 * dVar55 * 1.9940105822687055;
      if (dVar32 <= 0.08) {
        dVar30 = dVar32 * dVar266 * -0.14235295576 + dVar30 * 0.34138165292;
      }
      else {
        dVar30 = dVar242 * -3.7333333333333334 * dVar291 * dVar314 +
                 (dVar291 * (1.0 / dVar189) * dVar184 +
                 dVar232 * dVar55 * dVar144 * -2.3751029502456897 +
                 dVar291 * dVar54 * dVar157 +
                 (dVar241 * 24.3867456 * dVar291 +
                 __x_01 * dVar291 * -2.97366688 +
                 (dVar313 * dVar266 + dVar97 * dVar285) * -0.463292766 * __x_01 + dVar52 * dVar291)
                 * 1.7724538509055159 * dVar294 * 0.0625) * 0.5641895835477563 * -1.0666666666666667
                 * dVar56 + dVar242 * 2.1333333333333333 * dVar266 * dVar110;
      }
      dVar276 = dVar32 * __x_01 * -0.154430922;
      dVar305 = 1.0 / (dVar241 * dVar241);
      dVar232 = (dVar191 * dVar221 * dVar95 * dVar212) / 81.0;
      dVar191 = dVar147 * dVar210 * dVar98 * dVar58;
      dVar273 = dVar273 * dVar58;
      dVar206 = dVar228 / __x;
      dVar251 = __x * -2.97366688;
      dVar317 = (1.0 / __x_01) * dVar206;
      dVar233 = (1.0 / dVar241) * dVar146;
      dVar234 = dVar243 * dVar138 * dVar146 * dVar84;
      dVar243 = dVar210 * dVar143 * dVar256;
      dVar269 = dVar147 / (__x_06 * __x_06);
      dVar270 = dVar193 * 0.1646090534979424 * (dVar281 + -0.051955731) * dVar269 * dVar123;
      dVar306 = dVar305 * dVar228;
      dVar235 = dVar42 * dVar206;
      dVar281 = dVar57 * dVar305 * 1.3333333333333333;
      dVar305 = dVar37 * dVar205 * dVar24 * dVar112;
      dVar112 = dVar95 * -0.09259259259259259 * dVar112;
      dVar320 = dVar143 * dVar192 * dVar256 * -0.4444444444444444;
      dVar57 = dVar243 * -0.2962962962962963;
      dVar243 = dVar243 * -0.37037037037037035;
      dVar192 = (dVar192 / dVar207) * dVar211 * dVar113 * -0.49382716049382713 * dVar85;
      dVar207 = dVar193 * -0.2962962962962963 * dVar85;
      dVar85 = dVar193 * -0.24691358024691357 * dVar85;
      local_108 = 0.0;
      local_4d0 = 0.0;
      if (dVar236 < dVar19) {
        dVar193 = dVar219 * dVar191;
        dVar277 = (dVar193 * -0.6666666666666666 + dVar291) - dVar273 * 0.2222222222222222;
        dVar252 = dVar97 * dVar277 * dVar43;
        dVar260 = dVar266 * dVar43 * dVar32 * __x;
        dVar180 = dVar266 * dVar255 * dVar32;
        dVar30 = dVar30 * dVar97;
        local_4d0 = (dVar277 * dVar235 * dVar85 +
                    dVar291 * dVar306 * dVar207 +
                    (dVar180 + dVar180 + dVar30) * dVar295 * dVar194 * dVar123 +
                    ((dVar219 * dVar123 * dVar192 +
                     dVar277 * dVar206 * dVar233 * dVar243 +
                     dVar291 * dVar228 * dVar146 * dVar42 * dVar57 +
                     (dVar30 * 5.0 +
                     dVar180 * 10.0 +
                     dVar190 * dVar285 * -0.077215461 +
                     dVar260 * -0.154430922 +
                     dVar252 * -0.077215461 +
                     dVar193 * 0.051476974 +
                     (dVar290 * -0.154430922 - dVar259 * 0.077215461) + dVar267 * 0.077215461 +
                     dVar273 * 0.017158991333333335) * dVar81 * dVar84 +
                     ((dVar219 * dVar228 * dVar233 * dVar320 +
                      dVar277 * dVar317 * dVar112 +
                      ((((dVar30 * 15.0 +
                         dVar180 * 30.0 +
                         dVar190 * dVar285 * -0.463292766 +
                         dVar260 * -0.926585532 +
                         dVar252 * -0.463292766 +
                         dVar193 * 0.308861844 +
                         dVar267 * 0.463292766 +
                         dVar259 * -0.463292766 + dVar277 * dVar251 + dVar290 * -0.926585532 +
                         dVar273 * 0.102953948) * dVar25 * dVar95 * dVar212) / 27.0 +
                       (((dVar281 * dVar291 +
                         local_c68 * -0.8888888888888888 +
                         (dVar30 + dVar30 +
                         dVar180 * 4.0 +
                         dVar285 * dVar111 +
                         dVar266 * dVar43 * dVar276 +
                         dVar97 * dVar291 * -0.077215461 * dVar43 +
                         ((__x_01 * dVar291 * -0.74341672 + dVar290 * -0.154430922) -
                         dVar259 * 0.077215461) + dVar267 * 0.077215461) * -0.4444444444444444 *
                         dVar42) - (dVar219 * dVar212 * dVar305) / 27.0) - dVar232)) -
                      (dVar291 * dVar84 * dVar222) / 27.0)) - dVar234)) - dVar270)) * dVar60 +
                    ((double)(~uVar17 & (ulong)(dVar223 * dVar22 * 1.3333333333333333)) * dVar23 *
                     -0.36927938319101117 * dVar216 - dVar179);
      }
      dVar223 = -dVar94 * dVar138;
      if (dVar20 < dVar182) {
        local_108 = (double)(~uVar11 & (ulong)(-dVar143 - dVar223));
      }
      dVar182 = 0.0;
      dVar20 = 0.0;
      if (bVar5 && bVar4) {
        dVar20 = -dVar249;
      }
      dVar204 = dVar204 * dVar147 * 0.9847450218426964 * dVar178 * 0.125;
      dVar271 = dVar271 * dVar118;
      dVar30 = dVar271 * 0.7381058668197203;
      dVar259 = 1.0 / (dVar61 * dVar61);
      dVar266 = (double)(~uVar10 & (ulong)((dVar20 * dVar259) / 3.0));
      dVar193 = dVar147 * dVar98 * dVar93 * dVar266 * dVar161;
      dVar118 = dVar98 * dVar117 * dVar295;
      dVar249 = dVar118 * dVar161;
      dVar20 = dVar249 * 0.4920705778798135;
      dVar249 = dVar249 * 0.2222222222222222;
      dVar219 = dVar162 * 0.0;
      dVar61 = (dVar221 * dVar158) / 9.0;
      if (dVar62 <= 14.0) {
        dVar182 = (dVar25 * dVar117 * dVar220 * dVar266) / -3.0 - dVar61;
      }
      dVar271 = dVar271 / 3.0;
      dVar73 = dVar73 - 1.0 / dVar72;
      dVar75 = 1.0 / dVar75;
      dVar74 = 1.0 / dVar74;
      dVar168 = dVar168 * dVar214 * __x_05 * 7.5;
      dVar125 = dVar125 * -104.91264061509705;
      dVar267 = dVar296 * dVar127 * 31.5;
      dVar127 = -dVar198 * dVar124;
      dVar87 = dVar87 * (dVar83 - 1.0 / dVar80);
      dVar296 = ((dVar121 + dVar121) * dVar82 + -1.1283791670955126) * (1.0 / dVar121);
      dVar285 = dVar170 * dVar230 * 6.0;
      dVar170 = dVar89 * dVar197 * 0.5079873114034016;
      dVar291 = dVar124 * dVar162 * -0.738073119521991;
      dVar290 = dVar197 * dVar164 * 1.476146239043982;
      dVar124 = dVar165 * dVar162 * 3.0;
      dVar180 = dVar167 * dVar119 * 4.0;
      dVar298 = dVar298 * dVar199 * 0.23256793492310493;
      dVar80 = dVar230 * dVar231;
      dVar89 = ((1.0 / dVar86) / dVar264) * dVar213;
      dVar122 = dVar122 * (1.0 / (dVar309 * dVar309));
      dVar72 = dVar126 * dVar131 * 0.015430032176262;
      dVar252 = dVar245 * 0.8396081415605609;
      dVar126 = dVar244 * 1.0933029406300512;
      dVar121 = dVar315 * 0.0 * 81.27826616498021 * dVar198;
      dVar165 = dVar6 * dVar263 * 325.11306465992084;
      dVar309 = dVar309 * 10.154353453129625;
      dVar263 = dVar257 * dVar263 * 0.033607172124864;
      dVar167 = dVar246 * 0.13954076095386297;
      dVar264 = ((1.0 / dVar214) / dVar315) * dVar282 * -0.0091579568734894;
      dVar282 = dVar200 * -0.006541397766778144;
      dVar214 = (1.0 / (__x_05 * dVar315)) * dVar310 * -0.030266681701871703;
      dVar257 = dVar283 * -0.022700011276403777;
      if (dVar62 <= 14.0) {
        dVar315 = dVar197 * dVar6 * dVar182;
        dVar193 = dVar315 + dVar315 + dVar219;
        dVar310 = dVar198 * dVar193;
        dVar260 = dVar315 * 4.428635200918322 + dVar219 * 2.214317600459161;
        dVar182 = dVar298 * dVar193 * dVar79 +
                  dVar260 * dVar296 * dVar120 * 0.25 +
                  dVar182 * dVar180 +
                  dVar124 * dVar182 +
                  dVar290 * dVar182 +
                  dVar291 * dVar193 +
                  dVar170 * dVar193 +
                  (((dVar127 * dVar193 + dVar164 * dVar193) * dVar166 * 0.5080572 * __x_05 +
                    dVar285 * dVar182 +
                    (dVar86 * dVar193 * 6.19493084332416 +
                    dVar168 * dVar193 + (dVar315 * 18.0 + dVar219 * 9.0) * dVar297) * dVar245 *
                    -0.09302717396924197 * dVar79 +
                    ((dVar315 * -12.1933728 + (dVar310 * 54.0 - dVar219 * 6.0966864)) * dVar287 +
                    dVar125 * dVar193 + dVar267 * dVar193) * dVar199 * 0.0026165591067112575 *
                    dVar288 +
                   (dVar163 * dVar182 * -7.473256329443169 +
                   dVar78 * dVar182 * 21.087185174347326 +
                   dVar182 * 1.7059169152930056 + dVar162 * dVar182 * -12.48681162193212) *
                   3.141592653589793 * dVar82 * 0.5) - dVar260 * dVar87 * 0.5) +
                  dVar258 * ((dVar315 * 658.4421312 + dVar310 * -1458.0 + dVar219 * 329.2210656) *
                             dVar128 +
                            dVar263 * dVar193 +
                            dVar309 * dVar193 + dVar171 * dVar193 + dVar165 * dVar310 + dVar121) *
                            dVar130 * 0.007566670425467926 +
                  (dVar126 * dVar193 + dVar169 * -0.9874852102547023 * dVar193) * dVar78 +
                  (dVar129 * -1.2394393902309044 * dVar193 + dVar252 * dVar193) * dVar119 +
                  dVar311 * dVar182 +
                  (((dVar130 * dVar193 * -0.7525765385646315 - dVar193 * dVar72) * dVar163 +
                   dVar213 * dVar131 * dVar182 * dVar283 * 0.060533363403743407 +
                   dVar122 * dVar193 * dVar257 +
                   dVar258 * dVar193 * dVar214 +
                   dVar231 * dVar163 * dVar182 * dVar200 * 0.0183159137469788 +
                   dVar89 * dVar193 * dVar282 +
                   dVar288 * dVar193 * dVar264 +
                   (dVar80 * dVar193 * dVar167 -
                   dVar78 * dVar129 * dVar182 * dVar246 * 0.46513586984620986)) -
                  dVar83 * (dVar213 * -1.6419662276459916 * dVar182 +
                           dVar230 * dVar182 * 16.341819411519396 +
                           dVar62 * dVar182 * 6.537313195933369 +
                           dVar119 * dVar182 * -19.367359552567034) * 0.5);
      }
      else {
        dVar182 = ((dVar193 * -0.6666666666666666 + dVar271) - dVar249) * 0.5080572;
        dVar182 = dVar182 * dVar74 +
                  (((dVar193 * -1.4762117336394407 + dVar30) - dVar20) * dVar73 * 0.5080572 -
                  dVar75 * dVar182);
      }
      dVar193 = (dVar221 * dVar174 * dVar158 * dVar289) / 81.0;
      dVar174 = dVar98 * dVar58 * dVar147 * dVar93;
      dVar58 = dVar58 * dVar118;
      dVar221 = __x_00 * -2.97366688;
      dVar315 = dVar93 * dVar143 * dVar256;
      dVar277 = dVar265 / __x_00;
      dVar118 = (1.0 / __x_04) * dVar277;
      dVar310 = (1.0 / dVar215) * dVar202;
      dVar260 = dVar138 * dVar284 * dVar202 * dVar217;
      dVar247 = dVar176 * 0.1646090534979424 * dVar269 * (dVar247 + -0.051955731) * dVar248;
      dVar284 = dVar76 * dVar277;
      dVar205 = dVar24 * dVar117 * dVar205 * dVar136;
      dVar136 = dVar158 * -0.09259259259259259 * dVar136;
      dVar269 = dVar143 * dVar175 * dVar256 * -0.4444444444444444;
      dVar256 = dVar315 * -0.37037037037037035;
      dVar211 = dVar113 * dVar211 * (dVar175 / dVar71) * -0.49382716049382713 * dVar160;
      dVar24 = dVar176 * -0.24691358024691357 * dVar160;
      dVar113 = 0.0;
      if (dVar59 < local_e70) {
        dVar71 = dVar266 * dVar174;
        dVar113 = dVar71 * -0.6666666666666666 - dVar58 * 0.2222222222222222;
        dVar175 = dVar113 * dVar116 * dVar77;
        dVar113 = (dVar113 * dVar284 * dVar24 +
                  ((dVar266 * dVar248 * dVar211 +
                   dVar113 * dVar277 * dVar310 * dVar256 +
                   (dVar175 * -0.077215461 + dVar71 * 0.051476974 + dVar58 * 0.017158991333333335) *
                   dVar137 * dVar217 +
                   ((dVar266 * dVar265 * dVar310 * dVar269 +
                    dVar113 * dVar118 * dVar136 +
                    ((dVar175 * -0.463292766 +
                     dVar221 * dVar113 + dVar71 * 0.308861844 + dVar58 * 0.102953948) * dVar25 *
                     dVar158 * dVar289) / 27.0 +
                    ((dVar182 * -0.8888888888888888 + (dVar266 * dVar289 * dVar205) / -27.0) -
                    dVar193)) - dVar260)) - dVar247)) * dVar237 +
                  ((double)(~uVar18 & (ulong)(local_108 * dVar261 * 1.3333333333333333)) * dVar23 *
                   -0.36927938319101117 * dVar178 - dVar204);
      }
      pdVar1 = out->vrho;
      if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar7 = (long)(p->dim).vrho * sVar9;
        pdVar1[lVar7] = (local_4d0 + dVar113) * __x_06 + local_a98 + pdVar1[lVar7];
      }
      dVar182 = -dVar143 - dVar94 * dVar138;
      dVar94 = 0.0;
      if (bVar3 && bVar2) {
        dVar94 = dVar182;
      }
      dVar113 = 0.0;
      if (bVar5 && bVar4) {
        dVar113 = dVar182;
      }
      dVar113 = (double)(~uVar14 & (ulong)((dVar113 * dVar203) / 3.0));
      if (dVar27 <= 14.0) {
        dVar26 = (dVar25 * dVar37 * dVar220 * dVar113) / -3.0 - dVar26;
        dVar37 = dVar321 * dVar293 * dVar26;
        dVar36 = dVar37 + dVar37 + dVar318;
        dVar321 = dVar37 * 4.428635200918322 + dVar318 * 2.214317600459161;
        dVar148 = dVar36 * dVar186;
        dVar26 = dVar225 * dVar109 * dVar26 * dVar45 * 0.060533363403743407 +
                 dVar36 * dVar101 * dVar102 +
                 dVar36 * dVar188 * dVar319 +
                 local_e90 * 0.0183159137469788 * dVar150 * dVar187 * dVar26 +
                 dVar36 * dVar106 * local_e90 * -0.006541397766778144 +
                 dVar36 * dVar308 * dVar104 +
                 dVar301 * -0.46513586984620986 * dVar44 * dVar107 * dVar26 +
                 dVar36 * dVar227 * dVar47 +
                 dVar36 * dVar262 * dVar209 +
                 dVar155 * dVar321 * dVar100 * 0.25 +
                 (dVar36 * dVar107 * -1.2394393902309044 + dVar36 * dVar280) * dVar99 +
                 dVar240 * dVar26 +
                 ((dVar36 * dVar108 * -0.7525765385646315 + dVar36 * dVar105) * dVar150 -
                 dVar49 * (dVar225 * dVar26 * -1.6419662276459916 +
                          dVar208 * dVar26 * 16.341819411519396 +
                          dVar27 * dVar26 * 6.537313195933369 +
                          dVar26 * dVar99 * -19.367359552567034) * 0.5) +
                 dVar44 * (dVar239 * dVar36 + dVar36 * dVar226 * -0.9874852102547023) +
                 dVar36 * dVar46 +
                 (((dVar36 * dVar151 - dVar36 * dVar103) * dVar153 * 0.5080572 * __x_02 +
                   dVar292 * dVar26 +
                   ((dVar37 * 658.4421312 + dVar148 * -1458.0 + dVar318 * 329.2210656) * dVar279 +
                   dVar154 * dVar36 +
                   dVar299 * dVar36 + dVar156 * dVar36 + dVar53 * dVar148 + dVar152) * dVar108 *
                   0.007566670425467926 * dVar188 +
                   ((dVar37 * -12.1933728 + (dVar148 * 54.0 - dVar318 * 6.0966864)) * dVar278 +
                   dVar307 * dVar36 + dVar36 * dVar38) * dVar286 * 0.0026165591067112575 * dVar308 +
                   (dVar50 * dVar36 * 6.19493084332416 +
                   dVar272 * dVar36 + (dVar37 * 18.0 + dVar318 * 9.0) * dVar253) * dVar300 *
                   -0.09302717396924197 * dVar262 +
                   dVar268 * dVar26 + dVar304 * dVar26 + dVar312 * dVar36 + dVar275 * dVar26 +
                  (dVar26 * dVar150 * -7.473256329443169 +
                  dVar26 * dVar44 * 21.087185174347326 +
                  dVar26 * 1.7059169152930056 + dVar149 * dVar26 * -12.48681162193212) *
                  3.141592653589793 * dVar48 * 0.5) - dVar51 * dVar321 * 0.5);
      }
      else {
        dVar185 = dVar147 * dVar113 * dVar98 * dVar210 * dVar185;
        dVar26 = ((dVar185 * -0.6666666666666666 + dVar148) - dVar250) * 0.5080572;
        dVar26 = dVar26 * dVar40 +
                 (((dVar185 * -1.4762117336394407 + dVar36) - dVar139) * dVar39 * 0.5080572 -
                 dVar41 * dVar26);
      }
      local_e90 = local_e90 * -0.006541397766778144;
      dVar321 = 0.0;
      local_e28 = 0.0;
      if (dVar236 < dVar19) {
        dVar191 = dVar191 * dVar113;
        dVar36 = dVar191 * -0.6666666666666666 - dVar273 * 0.2222222222222222;
        dVar37 = dVar36 * dVar97 * dVar43;
        local_e28 = (dVar36 * dVar235 * dVar85 +
                    ((dVar192 * dVar113 * dVar123 +
                     dVar36 * dVar206 * dVar233 * dVar243 +
                     (dVar37 * -0.077215461 + dVar191 * 0.051476974 + dVar273 * 0.017158991333333335
                     ) * dVar81 * dVar84 +
                     ((dVar320 * dVar113 * dVar228 * dVar233 +
                      dVar36 * dVar317 * dVar112 +
                      ((dVar37 * -0.463292766 +
                       dVar273 * 0.102953948 + dVar251 * dVar36 + dVar191 * 0.308861844) * dVar25 *
                       dVar95 * dVar212) / 27.0 +
                      ((dVar26 * -0.8888888888888888 + (dVar305 * dVar113 * dVar212) / -27.0) -
                      dVar232)) - dVar234)) - dVar270)) * dVar60 +
                    ((double)(~uVar17 & (ulong)(dVar22 * 1.3333333333333333 * dVar94)) * dVar23 *
                     -0.36927938319101117 * dVar216 - dVar179);
      }
      dVar22 = 0.0;
      if (bVar3 && bVar2) {
        dVar22 = dVar143 - dVar223;
      }
      dVar94 = (dVar28 * dVar63 * ((1.0 / dVar64) / (local_e70 * local_e70))) / -9.0;
      dVar143 = 1.0 / (dVar68 + 1.0);
      dVar26 = 0.0;
      if (dVar115 <= 15.0) {
        dVar26 = (double)(~uVar12 & (ulong)dVar94 & -(ulong)(1.0 < dVar66));
        dVar26 = dVar26 - dVar68 * dVar26 * dVar143;
      }
      if (bVar5 && bVar4) {
        dVar321 = -dVar182;
      }
      dVar148 = (double)(~-(ulong)(dVar69 < 1e-15) &
                        ((ulong)dVar94 & uVar13 | ~uVar13 & (ulong)dVar26));
      dVar149 = dVar148 * dVar70 * dVar67 * dVar195;
      dVar182 = dVar67 * dVar116;
      dVar45 = dVar148 * dVar182;
      dVar293 = dVar67 * dVar148 * 0.01959362 + dVar45 * 0.1643336;
      dVar208 = dVar116 * dVar293 * dVar70;
      dVar223 = 1.0 / (dVar196 * dVar196);
      dVar37 = dVar67 * dVar229 * 0.2083128;
      dVar26 = dVar37 * dVar148 + dVar45 * 0.74976 + dVar148 * dVar229 * 0.0060412;
      dVar185 = dVar26 * dVar223 * dVar159;
      dVar36 = (dVar208 * 2.214317600459161 + dVar149 * 4.428635200918322) -
               dVar185 * 2.214317600459161;
      dVar94 = (double)(~uVar10 & (ulong)((dVar321 * dVar259) / 3.0));
      dVar321 = (dVar149 + dVar149 + dVar208) - dVar185;
      if (dVar62 <= 14.0) {
        dVar61 = (dVar25 * dVar117 * dVar220 * dVar94) / -3.0 - dVar61;
        dVar98 = dVar197 * dVar6 * dVar61;
        dVar20 = dVar98 + dVar98 + dVar219 + dVar321;
        dVar30 = dVar198 * dVar20;
        dVar271 = dVar98 * 4.428635200918322 + dVar219 * 2.214317600459161 + dVar36;
        local_898 = dVar79 * (dVar86 * dVar20 * 6.19493084332416 +
                             dVar168 * dVar20 +
                             (dVar98 * 18.0 +
                             dVar219 * 9.0 + dVar185 * -9.0 + dVar149 * 18.0 + dVar208 * 9.0) *
                             dVar297) * dVar245 * -0.09302717396924197 +
                    dVar163 * ((dVar130 * dVar20 * -0.7525765385646315 +
                               (dVar185 * -79.7154336165298 +
                               dVar149 * 159.4308672330596 + dVar208 * 79.7154336165298) *
                               0.007715016088131 * dVar244) - dVar72 * dVar20) +
                    dVar78 * (dVar126 * dVar20 + dVar169 * dVar20 * -0.9874852102547023) +
                    dVar311 * dVar61 +
                    (dVar129 * dVar20 * -1.2394393902309044 + dVar252 * dVar20) * dVar119 +
                    ((((dVar80 * dVar20 * dVar167 +
                       dVar79 * dVar20 * dVar298 +
                       dVar288 * dVar20 * dVar264 +
                       ((dVar98 * 658.4421312 +
                        dVar219 * 329.2210656 +
                        dVar185 * -329.2210656 +
                        dVar208 * 329.2210656 + dVar30 * -1458.0 + dVar149 * 658.4421312) * dVar128
                       + dVar263 * dVar20 +
                         dVar309 * dVar20 + dVar171 * dVar20 + dVar165 * dVar30 + dVar121) * dVar130
                       * 0.007566670425467926 * dVar258 +
                       dVar89 * dVar20 * dVar282 +
                       dVar231 * dVar163 * dVar61 * dVar200 * 0.0183159137469788) -
                      dVar246 * 0.46513586984620986 * dVar78 * dVar129 * dVar61) +
                     dVar120 * dVar296 * dVar271 * 0.25) -
                    dVar83 * (dVar213 * dVar61 * -1.6419662276459916 +
                             dVar230 * dVar61 * 16.341819411519396 +
                             dVar62 * dVar61 * 6.537313195933369 +
                             dVar61 * dVar119 * -19.367359552567034) * 0.5) +
                    dVar283 * 0.060533363403743407 * dVar213 * dVar131 * dVar61 +
                    dVar122 * dVar20 * dVar257 +
                    dVar258 * dVar20 * dVar214 +
                    ((dVar180 * dVar61 +
                      dVar124 * dVar61 +
                      dVar290 * dVar61 +
                      dVar20 * dVar291 +
                      ((dVar98 * -12.1933728 +
                       ((dVar185 * 6.0966864 +
                        dVar208 * -6.0966864 + dVar30 * 54.0 + dVar149 * -12.1933728) -
                       dVar219 * 6.0966864)) * dVar287 + dVar125 * dVar20 + dVar20 * dVar267) *
                      dVar199 * 0.0026165591067112575 * dVar288 +
                      dVar170 * dVar20 +
                      (dVar127 * dVar20 + dVar164 * dVar20) * dVar166 * 0.5080572 * __x_05 +
                      dVar285 * dVar61 +
                     (dVar61 * dVar163 * -7.473256329443169 +
                     dVar61 * dVar78 * 21.087185174347326 +
                     dVar61 * 1.7059169152930056 + dVar162 * dVar61 * -12.48681162193212) *
                     3.141592653589793 * dVar82 * 0.5) - dVar271 * dVar87 * 0.5);
      }
      else {
        dVar161 = dVar98 * dVar93 * dVar147 * dVar94 * dVar161;
        dVar271 = ((dVar161 * -0.6666666666666666 + dVar271 + dVar321) - dVar249) * 0.5080572;
        local_898 = dVar271 * dVar74 +
                    (((dVar161 * -1.4762117336394407 + dVar30 + dVar36) - dVar20) * dVar73 *
                     0.5080572 - dVar75 * dVar271);
      }
      dVar20 = exp(-__x_03);
      dVar271 = dVar195 * dVar223 * -6.4753871;
      dVar98 = dVar293 * 6.4753871 * dVar70 + dVar26 * dVar271;
      dVar132 = (1.0 / dVar182) * dVar132;
      dVar30 = (1.0 / dVar116) * dVar215 * dVar90;
      dVar26 = dVar67 * dVar77 + dVar67 * dVar77;
      dVar147 = (1.0 / dVar90) / (dVar215 * dVar215);
      dVar172 = dVar172 * -0.21875;
      dVar20 = dVar20 * dVar91 * 1.9940105822687055;
      if (dVar67 <= 0.08) {
        dVar36 = dVar67 * dVar148 * -0.14235295576 + dVar45 * 0.34138165292;
      }
      else {
        dVar36 = dVar133 * -3.7333333333333334 * dVar321 * dVar30 +
                 (dVar321 * (1.0 / dVar201) * dVar20 +
                 dVar36 * dVar91 * dVar21 * -2.3751029502456897 +
                 dVar321 * dVar147 * dVar172 +
                 (dVar215 * 24.3867456 * dVar321 +
                 __x_04 * dVar321 * -2.97366688 +
                 (dVar26 * dVar148 + dVar116 * dVar98) * -0.463292766 * __x_04 + dVar88 * dVar321) *
                 1.7724538509055159 * dVar302 * 0.0625) * 0.5641895835477563 * -1.0666666666666667 *
                 dVar114 + dVar133 * 2.1333333333333333 * dVar148 * dVar132;
      }
      dVar293 = 1.0 / (dVar215 * dVar215);
      dVar225 = dVar67 * __x_04 * -0.154430922;
      dVar45 = dVar293 * dVar265;
      dVar293 = dVar92 * dVar293 * 1.3333333333333333;
      dVar315 = dVar315 * -0.2962962962962963;
      dVar160 = dVar176 * -0.2962962962962963 * dVar160;
      dVar48 = 0.0;
      if (dVar59 < local_e70) {
        dVar174 = dVar174 * dVar94;
        dVar49 = (dVar174 * -0.6666666666666666 + dVar321) - dVar58 * 0.2222222222222222;
        dVar109 = dVar116 * dVar49 * dVar77;
        dVar152 = dVar148 * dVar77 * __x_00 * dVar67;
        dVar48 = dVar148 * dVar134 * dVar67;
        dVar36 = dVar36 * dVar116;
        dVar48 = (dVar49 * dVar284 * dVar24 +
                 dVar321 * dVar45 * dVar160 +
                 (dVar48 + dVar48 + dVar36) * dVar295 * dVar177 * dVar248 +
                 ((dVar211 * dVar94 * dVar248 +
                  dVar49 * dVar277 * dVar310 * dVar256 +
                  dVar321 * dVar265 * dVar202 * dVar76 * dVar315 +
                  (dVar36 * 5.0 +
                  dVar48 * 10.0 +
                  dVar173 * dVar98 * -0.077215461 +
                  dVar152 * -0.154430922 +
                  dVar109 * -0.077215461 +
                  dVar58 * 0.017158991333333335 +
                  dVar174 * 0.051476974 +
                  (dVar149 * -0.154430922 - dVar208 * 0.077215461) + dVar185 * 0.077215461) *
                  dVar137 * dVar217 +
                  ((dVar269 * dVar94 * dVar265 * dVar310 +
                   dVar49 * dVar118 * dVar136 +
                   ((((dVar36 * 15.0 +
                      dVar48 * 30.0 +
                      dVar173 * dVar98 * -0.463292766 +
                      dVar152 * -0.926585532 +
                      dVar109 * -0.463292766 +
                      dVar58 * 0.102953948 +
                      dVar174 * 0.308861844 +
                      dVar185 * 0.463292766 +
                      dVar208 * -0.463292766 + dVar49 * dVar221 + dVar149 * -0.926585532) * dVar25 *
                      dVar158 * dVar289) / 27.0 +
                    (((dVar293 * dVar321 +
                      local_898 * -0.8888888888888888 +
                      (dVar36 + dVar36 +
                      dVar48 * 4.0 +
                      dVar98 * dVar135 +
                      dVar148 * dVar77 * dVar225 +
                      dVar116 * dVar321 * -0.077215461 * dVar77 +
                      ((__x_04 * dVar321 * -0.74341672 + dVar149 * -0.154430922) -
                      dVar208 * 0.077215461) + dVar185 * 0.077215461) * -0.4444444444444444 * dVar76
                      ) - (dVar205 * dVar94 * dVar289) / 27.0) - dVar193)) -
                   (dVar321 * dVar217 * dVar142) / 27.0)) - dVar260)) - dVar247)) * dVar237 +
                 (dVar23 * (double)(~uVar18 & (ulong)(dVar22 * dVar261 * 1.3333333333333333)) *
                  -0.36927938319101117 * dVar178 - dVar204);
      }
      pdVar1 = out->vrho;
      if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar7 = (long)(p->dim).vrho * sVar9;
        pdVar1[lVar7 + 1] = (local_e28 + dVar48) * __x_06 + local_a98 + pdVar1[lVar7 + 1];
      }
      dVar22 = ((1.0 / dVar29) * dVar28 * dVar31) / 24.0;
      dVar29 = 0.0;
      if (dVar96 <= 15.0) {
        dVar29 = (double)(-(ulong)(1.0 < dVar322) & (ulong)dVar22);
        dVar29 = dVar29 - dVar33 * dVar29 * dVar218;
      }
      dVar22 = (double)(~-(ulong)(dVar34 < 1e-15) &
                       (~-(ulong)(dVar96 < 1.0) & (ulong)dVar29 |
                       (ulong)dVar22 & -(ulong)(dVar96 < 1.0)));
      dVar205 = dVar32 * dVar183 * dVar35 * dVar22;
      dVar316 = dVar316 * dVar22;
      dVar322 = dVar32 * dVar22 * 0.01959362 + dVar316 * 0.1643336;
      dVar29 = dVar97 * dVar322 * dVar35;
      dVar261 = dVar303 * dVar22 + dVar316 * 0.74976 + dVar224 * dVar22 * 0.0060412;
      dVar145 = dVar145 * dVar274 * dVar261;
      dVar94 = dVar145 * -2.214317600459161 +
               dVar205 * 4.428635200918322 + dVar29 * 2.214317600459161;
      dVar23 = (dVar205 + dVar205 + dVar29) - dVar145;
      if (dVar27 <= 14.0) {
        dVar186 = dVar186 * dVar23;
        dVar27 = dVar153 * (dVar151 * dVar23 - dVar103 * dVar23) * 0.5080572 * __x_02 +
                 dVar102 * dVar101 * dVar23 +
                 dVar319 * dVar188 * dVar23 +
                 (dVar279 * (dVar145 * -329.2210656 +
                            dVar29 * 329.2210656 + dVar186 * -1458.0 + dVar205 * 658.4421312) +
                 dVar154 * dVar23 + dVar299 * dVar23 + dVar53 * dVar186 + dVar156 * dVar23) *
                 dVar108 * 0.007566670425467926 * dVar188 +
                 dVar104 * dVar308 * dVar23 +
                 dVar286 * (dVar278 * (dVar145 * 6.0966864 +
                                      dVar29 * -6.0966864 + dVar186 * 54.0 + dVar205 * -12.1933728)
                           + dVar307 * dVar23 + dVar38 * dVar23) * 0.0026165591067112575 * dVar308 +
                 (dVar105 * dVar23 +
                 dVar108 * dVar23 * -0.7525765385646315 +
                 dVar238 * (dVar145 * -79.7154336165298 +
                           dVar205 * 159.4308672330596 + dVar29 * 79.7154336165298) *
                           0.007715016088131) * dVar150 +
                 dVar47 * dVar227 * dVar23 +
                 dVar209 * dVar262 * dVar23 +
                 dVar300 * (dVar50 * dVar23 * 6.19493084332416 +
                           dVar272 * dVar23 +
                           dVar253 * (dVar145 * -9.0 + dVar205 * 18.0 + dVar29 * 9.0)) *
                 -0.09302717396924197 * dVar262 +
                 (dVar239 * dVar23 + dVar226 * dVar23 * -0.9874852102547023) * dVar44 +
                 (dVar107 * dVar23 * -1.2394393902309044 + dVar280 * dVar23) * dVar99 +
                 dVar312 * dVar23 +
                 dVar46 * dVar23 + dVar51 * dVar94 * -0.5 + dVar100 * dVar155 * dVar94 * 0.25 +
                 local_e90 * dVar106 * dVar23;
      }
      else {
        dVar27 = dVar23 * 0.5080572 * dVar40 +
                 (dVar39 * dVar94 * 0.5080572 - dVar41 * dVar23 * 0.5080572);
      }
      dVar261 = dVar322 * 6.4753871 * dVar35 + dVar254 * dVar261;
      if (dVar32 <= 0.08) {
        dVar94 = dVar32 * dVar22 * -0.14235295576 + dVar316 * 0.34138165292;
      }
      else {
        dVar94 = dVar242 * -3.7333333333333334 * dVar314 * dVar23 +
                 (dVar184 * (1.0 / dVar189) * dVar23 +
                 dVar55 * dVar94 * -2.3751029502456897 * dVar144 +
                 dVar157 * dVar54 * dVar23 +
                 dVar294 * (dVar241 * 24.3867456 * dVar23 +
                           __x_01 * dVar23 * -2.97366688 +
                           (dVar313 * dVar22 + dVar97 * dVar261) * -0.463292766 * __x_01 +
                           dVar52 * dVar23) * 1.7724538509055159 * 0.0625) * 0.5641895835477563 *
                 -1.0666666666666667 * dVar56 + dVar242 * 2.1333333333333333 * dVar110 * dVar22;
      }
      dVar144 = 0.0;
      if (dVar236 < dVar19) {
        dVar322 = dVar97 * dVar23 * dVar43;
        dVar144 = dVar255 * dVar32 * dVar22;
        dVar94 = dVar94 * dVar97;
        dVar236 = dVar322 * 0.077215461;
        dVar19 = dVar32 * __x * dVar43 * dVar22;
        auVar181._0_8_ =
             dVar212 * (dVar94 * 15.0 +
                       dVar144 * 30.0 +
                       dVar190 * dVar261 * -0.463292766 +
                       dVar19 * -0.926585532 +
                       dVar322 * -0.463292766 +
                       dVar145 * 0.463292766 +
                       dVar29 * -0.463292766 + dVar251 * dVar23 + dVar205 * -0.926585532) * dVar25 *
                       dVar95;
        auVar181._8_8_ = dVar222 * dVar23 * dVar84;
        auVar140 = divpd(auVar181,_DAT_00f530f0);
        dVar144 = dVar60 * (dVar85 * dVar235 * dVar23 +
                           dVar207 * dVar306 * dVar23 +
                           dVar194 * (dVar144 + dVar144 + dVar94) * dVar295 * dVar123 +
                           dVar243 * dVar233 * dVar206 * dVar23 +
                           dVar57 * dVar146 * dVar42 * dVar228 * dVar23 +
                           dVar81 * (dVar94 * 5.0 +
                                    dVar144 * 10.0 +
                                    dVar190 * dVar261 * -0.077215461 +
                                    dVar19 * -0.154430922 +
                                    (((dVar205 * -0.154430922 - dVar29 * 0.077215461) +
                                     dVar145 * 0.077215461) - dVar236)) * dVar84 +
                           dVar112 * dVar317 * dVar23 +
                           ((dVar281 * dVar23 +
                             dVar27 * -0.8888888888888888 +
                             dVar42 * (dVar94 + dVar94 +
                                      dVar144 * 4.0 +
                                      dVar111 * dVar261 +
                                      dVar276 * dVar43 * dVar22 +
                                      ((((__x_01 * dVar23 * -0.74341672 + dVar205 * -0.154430922) -
                                        dVar29 * 0.077215461) + dVar145 * 0.077215461) - dVar236)) *
                                      -0.4444444444444444 + auVar140._0_8_) - auVar140._8_8_));
      }
      pdVar1 = out->vsigma;
      if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar7 = (long)(p->dim).vsigma * sVar9;
        dVar19 = (pdVar1 + lVar7)[1];
        pdVar1[lVar7] = dVar144 * __x_06 + pdVar1[lVar7];
        (pdVar1 + lVar7)[1] = dVar19 + 0.0;
      }
      dVar236 = (dVar28 * (1.0 / dVar63) * dVar65) / 24.0;
      dVar19 = 0.0;
      if (dVar115 <= 15.0) {
        dVar19 = (double)(-(ulong)(1.0 < dVar66) & (ulong)dVar236);
        dVar19 = dVar19 - dVar68 * dVar19 * dVar143;
      }
      dVar236 = (double)(~-(ulong)(dVar69 < 1e-15) &
                        (~-(ulong)(dVar115 < 1.0) & (ulong)dVar19 |
                        (ulong)dVar236 & -(ulong)(dVar115 < 1.0)));
      dVar19 = dVar67 * dVar195 * dVar70 * dVar236;
      dVar182 = dVar182 * dVar236;
      dVar28 = dVar67 * dVar236 * 0.01959362 + dVar182 * 0.1643336;
      dVar23 = dVar116 * dVar28 * dVar70;
      dVar29 = dVar37 * dVar236 + dVar182 * 0.74976 + dVar229 * dVar236 * 0.0060412;
      dVar159 = dVar159 * dVar223 * dVar29;
      dVar27 = dVar159 * -2.214317600459161 +
               dVar19 * 4.428635200918322 + dVar23 * 2.214317600459161;
      dVar22 = (dVar19 + dVar19 + dVar23) - dVar159;
      if (dVar62 <= 14.0) {
        dVar198 = dVar198 * dVar22;
        local_6a8 = dVar166 * (dVar127 * dVar22 + dVar164 * dVar22) * 0.5080572 * __x_05 +
                    dVar257 * dVar122 * dVar22 +
                    dVar214 * dVar258 * dVar22 +
                    (dVar128 * (dVar159 * -329.2210656 +
                               dVar23 * 329.2210656 + dVar198 * -1458.0 + dVar19 * 658.4421312) +
                    dVar263 * dVar22 + dVar309 * dVar22 + dVar165 * dVar198 + dVar171 * dVar22) *
                    dVar130 * 0.007566670425467926 * dVar258 +
                    dVar282 * dVar89 * dVar22 +
                    dVar264 * dVar288 * dVar22 +
                    dVar199 * (dVar287 * (dVar159 * 6.0966864 +
                                         dVar23 * -6.0966864 + dVar198 * 54.0 + dVar19 * -12.1933728
                                         ) + dVar125 * dVar22 + dVar267 * dVar22) *
                    0.0026165591067112575 * dVar288 +
                    (-dVar72 * dVar22 +
                    dVar130 * dVar22 * -0.7525765385646315 +
                    dVar244 * (dVar159 * -79.7154336165298 +
                              dVar19 * 159.4308672330596 + dVar23 * 79.7154336165298) *
                              0.007715016088131) * dVar163 +
                    dVar167 * dVar80 * dVar22 +
                    dVar298 * dVar79 * dVar22 +
                    dVar245 * (dVar86 * dVar22 * 6.19493084332416 +
                              dVar168 * dVar22 +
                              dVar297 * (dVar159 * -9.0 + dVar19 * 18.0 + dVar23 * 9.0)) *
                    -0.09302717396924197 * dVar79 +
                    (dVar126 * dVar22 + dVar169 * dVar22 * -0.9874852102547023) * dVar78 +
                    (dVar129 * dVar22 * -1.2394393902309044 + dVar252 * dVar22) * dVar119 +
                    dVar291 * dVar22 +
                    dVar170 * dVar22 + dVar87 * dVar27 * -0.5 + dVar120 * dVar296 * dVar27 * 0.25;
      }
      else {
        local_6a8 = dVar22 * 0.5080572 * dVar74 +
                    (dVar73 * dVar27 * 0.5080572 - dVar75 * dVar22 * 0.5080572);
      }
      dVar29 = dVar28 * 6.4753871 * dVar70 + dVar271 * dVar29;
      if (dVar67 <= 0.08) {
        dVar20 = dVar67 * dVar236 * -0.14235295576 + dVar182 * 0.34138165292;
      }
      else {
        dVar20 = dVar133 * -3.7333333333333334 * dVar30 * dVar22 +
                 (dVar20 * (1.0 / dVar201) * dVar22 +
                 dVar91 * dVar27 * -2.3751029502456897 * dVar21 +
                 dVar172 * dVar147 * dVar22 +
                 dVar302 * (dVar215 * 24.3867456 * dVar22 +
                           __x_04 * dVar22 * -2.97366688 +
                           (dVar26 * dVar236 + dVar116 * dVar29) * -0.463292766 * __x_04 +
                           dVar88 * dVar22) * 1.7724538509055159 * 0.0625) * 0.5641895835477563 *
                 -1.0666666666666667 * dVar114 + dVar133 * 2.1333333333333333 * dVar132 * dVar236;
      }
      dVar21 = 0.0;
      if (dVar59 < local_e70) {
        dVar21 = dVar116 * dVar22 * dVar77;
        dVar28 = dVar134 * dVar67 * dVar236;
        dVar20 = dVar20 * dVar116;
        dVar26 = dVar21 * 0.077215461;
        dVar27 = __x_00 * dVar67 * dVar77 * dVar236;
        auVar141._0_8_ =
             dVar289 * dVar25 * (dVar20 * 15.0 +
                                dVar28 * 30.0 +
                                dVar173 * dVar29 * -0.463292766 +
                                dVar27 * -0.926585532 +
                                dVar21 * -0.463292766 +
                                dVar159 * 0.463292766 +
                                dVar23 * -0.463292766 + dVar221 * dVar22 + dVar19 * -0.926585532) *
                       dVar158;
        auVar141._8_8_ = dVar142 * dVar22 * dVar217;
        auVar140 = divpd(auVar141,_DAT_00f530f0);
        dVar21 = dVar237 * (dVar24 * dVar284 * dVar22 +
                           dVar160 * dVar45 * dVar22 +
                           dVar177 * dVar295 * (dVar28 + dVar28 + dVar20) * dVar248 +
                           dVar256 * dVar310 * dVar277 * dVar22 +
                           dVar315 * dVar202 * dVar76 * dVar265 * dVar22 +
                           dVar137 * (dVar20 * 5.0 +
                                     dVar28 * 10.0 +
                                     dVar173 * dVar29 * -0.077215461 +
                                     dVar27 * -0.154430922 +
                                     (((dVar19 * -0.154430922 - dVar23 * 0.077215461) +
                                      dVar159 * 0.077215461) - dVar26)) * dVar217 +
                           dVar136 * dVar118 * dVar22 +
                           ((dVar293 * dVar22 +
                             local_6a8 * -0.8888888888888888 +
                             dVar76 * (dVar20 + dVar20 +
                                      dVar28 * 4.0 +
                                      dVar135 * dVar29 +
                                      dVar225 * dVar77 * dVar236 +
                                      ((((__x_04 * dVar22 * -0.74341672 + dVar19 * -0.154430922) -
                                        dVar23 * 0.077215461) + dVar159 * 0.077215461) - dVar26)) *
                                      -0.4444444444444444 + auVar140._0_8_) - auVar140._8_8_));
      }
      if ((pdVar1 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
        lVar7 = (long)(p->dim).vsigma * sVar9;
        pdVar1[lVar7 + 2] = __x_06 * dVar21 + pdVar1[lVar7 + 2];
      }
    }
  }
  return;
}

Assistant:

static void
WORK_GGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np, const double *rho, const double *sigma,
         xc_gga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  /*feenableexcept(FE_DIVBYZERO | FE_INVALID);*/
#endif

  size_t ip;
  double dens;
  double my_rho[2] = {0.0, 0.0};
  double my_sigma[3] = {0.0, 0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;
    
    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));
    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, out);
    
    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 %le 0.0 %le 0.0 0.0 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(sigma, ip, 0));
        }else{
          printf("./xc-get_data %d 2 %le %le %le %le %le 0.0 0.0 0.0 0.0\n",
                 p->info->number, VAR(rho, ip, 0), VAR(rho, ip, 1),
                 VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2));
        }
      }
    }
#endif
  }   /* for(ip) */

}